

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::pumpTo(AsyncPipe *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  int iVar2;
  void *pvVar3;
  long in_RCX;
  
  if (in_RCX == 0) {
    if (_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE == '\0') {
      iVar2 = __cxa_guard_acquire(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      if (iVar2 != 0) {
        kj::_::ImmediatePromiseNodeBase::ImmediatePromiseNodeBase
                  ((ImmediatePromiseNodeBase *)
                   _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
        _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE._0_8_ = &PTR_destroy_00706338;
        __cxa_atexit(kj::_::ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,
                     _ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE,&__dso_handle);
        __cxa_guard_release(&_ZGVZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE);
      }
    }
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)_ZZN2kj12constPromiseImTnT_Lm0EEENS_7PromiseIS1_EEvE4NODE
    ;
  }
  else {
    pp_Var1 = output[4]._vptr_AsyncOutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pvVar3 = operator_new(0x400);
      *(undefined8 *)((long)pvVar3 + 0x1f8) = 0;
      *(undefined8 *)((long)pvVar3 + 0x200) = 0;
      *(undefined ***)((long)pvVar3 + 0x1f0) = &PTR_destroy_0070a928;
      *(undefined ***)((long)pvVar3 + 0x208) = &PTR_reject_0070a978;
      *(undefined1 *)((long)pvVar3 + 0x210) = 0;
      *(undefined1 *)((long)pvVar3 + 0x3a8) = 0;
      *(undefined1 *)((long)pvVar3 + 0x3b8) = 1;
      *(undefined ***)((long)pvVar3 + 0x3c0) = &PTR_read_0070a9d8;
      *(undefined ***)((long)pvVar3 + 0x3c8) = &PTR_write_0070aa98;
      *(long *)((long)pvVar3 + 0x3d0) = (long)pvVar3 + 0x208;
      *(AsyncOutputStream **)((long)pvVar3 + 0x3d8) = output;
      *(uint64_t *)((long)pvVar3 + 0x3e0) = amount;
      *(long *)((long)pvVar3 + 1000) = in_RCX;
      *(undefined8 *)((long)pvVar3 + 0x3f0) = 0;
      *(undefined8 *)((long)pvVar3 + 0x3f8) = 0;
      output[4]._vptr_AsyncOutputStream = (_func_int **)((long)pvVar3 + 0x3c0);
      *(void **)((long)pvVar3 + 0x1f8) = pvVar3;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)((long)pvVar3 + 0x1f0);
    }
    else {
      (**(code **)(*pp_Var1 + 0x18))(this,pp_Var1,amount);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.pumpTo(output, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpTo>(*this, output, amount);
    }
  }